

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  testing_base tb;
  
  tb = testing_new(argc,argv,0);
  testing_run_(tb,benchmark_ping_pong_mu,"benchmark_ping_pong_mu",1);
  testing_run_(tb,benchmark_ping_pong_mu_unexpired_deadline,
               "benchmark_ping_pong_mu_unexpired_deadline",1);
  testing_run_(tb,benchmark_ping_pong_mu_cv,"benchmark_ping_pong_mu_cv",1);
  testing_run_(tb,benchmark_ping_pong_mu_cv_unexpired_deadline,
               "benchmark_ping_pong_mu_cv_unexpired_deadline",1);
  testing_run_(tb,benchmark_ping_pong_mutex_cond,"benchmark_ping_pong_mutex_cond",1);
  testing_run_(tb,benchmark_ping_pong_mutex_cond_unexpired_deadline,
               "benchmark_ping_pong_mutex_cond_unexpired_deadline",1);
  testing_run_(tb,benchmark_ping_pong_mutex_cv,"benchmark_ping_pong_mutex_cv",1);
  testing_run_(tb,benchmark_ping_pong_rwmutex_cv,"benchmark_ping_pong_rwmutex_cv",1);
  testing_run_(tb,benchmark_ping_pong_wait_n_cv,"benchmark_ping_pong_wait_n_cv",1);
  iVar1 = testing_base_exit(tb);
  return iVar1;
}

Assistant:

int main (int argc, char *argv[]) {
	testing_base tb = testing_new (argc, argv, 0);

	BENCHMARK_RUN (tb, benchmark_ping_pong_mu);
	BENCHMARK_RUN (tb, benchmark_ping_pong_mu_unexpired_deadline);
	BENCHMARK_RUN (tb, benchmark_ping_pong_mu_cv);
	BENCHMARK_RUN (tb, benchmark_ping_pong_mu_cv_unexpired_deadline);
	BENCHMARK_RUN (tb, benchmark_ping_pong_mutex_cond);
	BENCHMARK_RUN (tb, benchmark_ping_pong_mutex_cond_unexpired_deadline);
	BENCHMARK_RUN (tb, benchmark_ping_pong_mutex_cv);
	BENCHMARK_RUN (tb, benchmark_ping_pong_rwmutex_cv);
	BENCHMARK_RUN (tb, benchmark_ping_pong_wait_n_cv);

	return (testing_base_exit (tb));
}